

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-quants.c
# Opt level: O2

void quantize_row_q8_0_ref(float *x,block_q8_0 *y,int64_t k)

{
  ggml_fp16_t gVar1;
  int j;
  long lVar2;
  uint uVar3;
  ulong uVar4;
  int8_t *piVar5;
  int j_1;
  ulong uVar6;
  float fVar7;
  float fVar8;
  
  uVar4 = 0;
  uVar6 = k / 0x20 & 0xffffffff;
  if ((int)(k / 0x20) < 1) {
    uVar6 = uVar4;
  }
  piVar5 = y->qs;
  for (; uVar4 != uVar6; uVar4 = uVar4 + 1) {
    uVar3 = (uint)uVar4 & 0x7ffffff;
    fVar7 = 0.0;
    for (lVar2 = 0; lVar2 != 0x20; lVar2 = lVar2 + 1) {
      if (fVar7 <= ABS(x[(ulong)uVar3 * 0x20 + lVar2])) {
        fVar7 = ABS(x[(ulong)uVar3 * 0x20 + lVar2]);
      }
    }
    fVar7 = fVar7 / 127.0;
    gVar1 = ggml_compute_fp32_to_fp16(fVar7);
    y[uVar4].d = gVar1;
    for (lVar2 = 0; lVar2 != 0x20; lVar2 = lVar2 + 1) {
      fVar8 = roundf(x[(ulong)uVar3 * 0x20 + lVar2] *
                     (float)(-(uint)(fVar7 != 0.0) & (uint)(1.0 / fVar7)));
      piVar5[lVar2] = (int8_t)(int)fVar8;
    }
    piVar5 = piVar5 + 0x22;
  }
  return;
}

Assistant:

void quantize_row_q8_0_ref(const float * GGML_RESTRICT x, block_q8_0 * GGML_RESTRICT y, int64_t k) {
    assert(k % QK8_0 == 0);
    const int nb = k / QK8_0;

    for (int i = 0; i < nb; i++) {
        float amax = 0.0f; // absolute max

        for (int j = 0; j < QK8_0; j++) {
            const float v = x[i*QK8_0 + j];
            amax = MAX(amax, fabsf(v));
        }

        const float d = amax / ((1 << 7) - 1);
        const float id = d ? 1.0f/d : 0.0f;

        y[i].d = GGML_FP32_TO_FP16(d);

        for (int j = 0; j < QK8_0; ++j) {
            const float x0 = x[i*QK8_0 + j]*id;

            y[i].qs[j] = roundf(x0);
        }
    }
}